

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pass.h
# Opt level: O2

size_t __thiscall
trieste::PassDef::apply_special<false,false,false>(PassDef *this,Node *root,Match *match)

{
  Node *node;
  __shared_ptr<trieste::NodeDef,(__gnu_cxx::_Lock_policy)2> *p_Var1;
  element_type *peVar2;
  long lVar3;
  undefined8 *puVar4;
  char cVar5;
  bool bVar6;
  ptrdiff_t pVar7;
  long lVar8;
  undefined8 *puVar9;
  size_t sVar10;
  iterator it;
  iterator start;
  vector<std::pair<std::shared_ptr<trieste::NodeDef>_&,___gnu_cxx::__normal_iterator<std::shared_ptr<trieste::NodeDef>_*,_std::vector<std::shared_ptr<trieste::NodeDef>,_std::allocator<std::shared_ptr<trieste::NodeDef>_>_>_>_>,_std::allocator<std::pair<std::shared_ptr<trieste::NodeDef>_&,___gnu_cxx::__normal_iterator<std::shared_ptr<trieste::NodeDef>_*,_std::vector<std::shared_ptr<trieste::NodeDef>,_std::allocator<std::shared_ptr<trieste::NodeDef>_>_>_>_>_>_>
  path;
  Node root_1;
  pair<std::shared_ptr<trieste::NodeDef>_&,___gnu_cxx::__normal_iterator<std::shared_ptr<trieste::NodeDef>_*,_std::vector<std::shared_ptr<trieste::NodeDef>,_std::allocator<std::shared_ptr<trieste::NodeDef>_>_>_>_>
  local_90;
  PassDef *local_80;
  NodeIt local_78;
  long local_70;
  _Vector_base<std::pair<std::shared_ptr<trieste::NodeDef>_&,___gnu_cxx::__normal_iterator<std::shared_ptr<trieste::NodeDef>_*,_std::vector<std::shared_ptr<trieste::NodeDef>,_std::allocator<std::shared_ptr<trieste::NodeDef>_>_>_>_>,_std::allocator<std::pair<std::shared_ptr<trieste::NodeDef>_&,___gnu_cxx::__normal_iterator<std::shared_ptr<trieste::NodeDef>_*,_std::vector<std::shared_ptr<trieste::NodeDef>,_std::allocator<std::shared_ptr<trieste::NodeDef>_>_>_>_>_>_>
  local_68;
  size_t local_48;
  long local_40;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_38;
  
  std::__shared_ptr<trieste::NodeDef,(__gnu_cxx::_Lock_policy)2>::
  __shared_ptr<trieste::NodeDef,void>
            ((__shared_ptr<trieste::NodeDef,(__gnu_cxx::_Lock_policy)2> *)&local_40,
             (__weak_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2> *)
             (root->super___shared_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2>)._M_ptr);
  if ((*(byte *)(*(long *)(local_40 + 0x10) + 8) & 0x40) == 0) {
    local_68._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_68._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_68._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_90.second._M_current = *(shared_ptr<trieste::NodeDef> **)(local_40 + 0x58);
    local_90.first = (shared_ptr<trieste::NodeDef> *)&local_40;
    std::
    vector<std::pair<std::shared_ptr<trieste::NodeDef>&,__gnu_cxx::__normal_iterator<std::shared_ptr<trieste::NodeDef>*,std::vector<std::shared_ptr<trieste::NodeDef>,std::allocator<std::shared_ptr<trieste::NodeDef>>>>>,std::allocator<std::pair<std::shared_ptr<trieste::NodeDef>&,__gnu_cxx::__normal_iterator<std::shared_ptr<trieste::NodeDef>*,std::vector<std::shared_ptr<trieste::NodeDef>,std::allocator<std::shared_ptr<trieste::NodeDef>>>>>>>
    ::
    emplace_back<std::pair<std::shared_ptr<trieste::NodeDef>&,__gnu_cxx::__normal_iterator<std::shared_ptr<trieste::NodeDef>*,std::vector<std::shared_ptr<trieste::NodeDef>,std::allocator<std::shared_ptr<trieste::NodeDef>>>>>>
              ((vector<std::pair<std::shared_ptr<trieste::NodeDef>&,__gnu_cxx::__normal_iterator<std::shared_ptr<trieste::NodeDef>*,std::vector<std::shared_ptr<trieste::NodeDef>,std::allocator<std::shared_ptr<trieste::NodeDef>>>>>,std::allocator<std::pair<std::shared_ptr<trieste::NodeDef>&,__gnu_cxx::__normal_iterator<std::shared_ptr<trieste::NodeDef>*,std::vector<std::shared_ptr<trieste::NodeDef>,std::allocator<std::shared_ptr<trieste::NodeDef>>>>>>>
                *)&local_68,&local_90);
    sVar10 = 0;
    while (local_68._M_impl.super__Vector_impl_data._M_start !=
           local_68._M_impl.super__Vector_impl_data._M_finish) {
      node = local_68._M_impl.super__Vector_impl_data._M_finish[-1].first;
      p_Var1 = (__shared_ptr<trieste::NodeDef,(__gnu_cxx::_Lock_policy)2> *)
               local_68._M_impl.super__Vector_impl_data._M_finish[-1].second._M_current;
      peVar2 = (node->super___shared_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
      if (p_Var1 == (__shared_ptr<trieste::NodeDef,(__gnu_cxx::_Lock_policy)2> *)
                    (peVar2->children).
                    super__Vector_base<std::shared_ptr<trieste::NodeDef>,_std::allocator<std::shared_ptr<trieste::NodeDef>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish) {
        lVar3 = *(long *)((long)(this->rule_map).map._M_elems +
                         (ulong)(((peVar2->type_).def)->default_map_id & 0xfffffff8));
        local_80 = this;
        if (*(char *)(lVar3 + 0x418) == '\0') {
          local_90.first =
               (peVar2->children).
               super__Vector_base<std::shared_ptr<trieste::NodeDef>,_std::allocator<std::shared_ptr<trieste::NodeDef>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
          local_70 = 0;
          local_48 = sVar10;
LAB_001625c0:
          lVar8 = local_70;
          sVar10 = local_48;
          if ((__shared_ptr<trieste::NodeDef,(__gnu_cxx::_Lock_policy)2> *)local_90.first !=
              (__shared_ptr<trieste::NodeDef,(__gnu_cxx::_Lock_policy)2> *)
              (((node->super___shared_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)->
              children).
              super__Vector_base<std::shared_ptr<trieste::NodeDef>,_std::allocator<std::shared_ptr<trieste::NodeDef>_>_>
              ._M_impl.super__Vector_impl_data._M_finish) {
            puVar9 = *(undefined8 **)
                      (lVar3 + 0x18 +
                      (ulong)(*(uint *)(*(long *)(*(long *)local_90.first + 0x10) + 0xc) &
                             0xfffffff8));
            puVar4 = (undefined8 *)puVar9[1];
            local_78._M_current = local_90.first;
            for (puVar9 = (undefined8 *)*puVar9; puVar9 != puVar4; puVar9 = puVar9 + 0x14) {
              match->index = 0;
              ((match->captures).
               super__Vector_base<std::pair<bool,_std::map<trieste::Token,_std::pair<__gnu_cxx::__normal_iterator<std::shared_ptr<trieste::NodeDef>_*,_std::vector<std::shared_ptr<trieste::NodeDef>,_std::allocator<std::shared_ptr<trieste::NodeDef>_>_>_>,___gnu_cxx::__normal_iterator<std::shared_ptr<trieste::NodeDef>_*,_std::vector<std::shared_ptr<trieste::NodeDef>,_std::allocator<std::shared_ptr<trieste::NodeDef>_>_>_>_>,_std::less<trieste::Token>,_std::allocator<std::pair<const_trieste::Token,_std::pair<__gnu_cxx::__normal_iterator<std::shared_ptr<trieste::NodeDef>_*,_std::vector<std::shared_ptr<trieste::NodeDef>,_std::allocator<std::shared_ptr<trieste::NodeDef>_>_>_>,___gnu_cxx::__normal_iterator<std::shared_ptr<trieste::NodeDef>_*,_std::vector<std::shared_ptr<trieste::NodeDef>,_std::allocator<std::shared_ptr<trieste::NodeDef>_>_>_>_>_>_>_>_>,_std::allocator<std::pair<bool,_std::map<trieste::Token,_std::pair<__gnu_cxx::__normal_iterator<std::shared_ptr<trieste::NodeDef>_*,_std::vector<std::shared_ptr<trieste::NodeDef>,_std::allocator<std::shared_ptr<trieste::NodeDef>_>_>_>,___gnu_cxx::__normal_iterator<std::shared_ptr<trieste::NodeDef>_*,_std::vector<std::shared_ptr<trieste::NodeDef>,_std::allocator<std::shared_ptr<trieste::NodeDef>_>_>_>_>,_std::less<trieste::Token>,_std::allocator<std::pair<const_trieste::Token,_std::pair<__gnu_cxx::__normal_iterator<std::shared_ptr<trieste::NodeDef>_*,_std::vector<std::shared_ptr<trieste::NodeDef>,_std::allocator<std::shared_ptr<trieste::NodeDef>_>_>_>,___gnu_cxx::__normal_iterator<std::shared_ptr<trieste::NodeDef>_*,_std::vector<std::shared_ptr<trieste::NodeDef>,_std::allocator<std::shared_ptr<trieste::NodeDef>_>_>_>_>_>_>_>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start)->first = false;
              local_90.first = local_78._M_current;
              cVar5 = (**(code **)(*(long *)*puVar9 + 0x20))((long *)*puVar9,&local_90,node,match);
              if (((cVar5 != '\0') &&
                  (bVar6 = std::
                           any_of<__gnu_cxx::__normal_iterator<std::shared_ptr<trieste::NodeDef>*,std::vector<std::shared_ptr<trieste::NodeDef>,std::allocator<std::shared_ptr<trieste::NodeDef>>>>,trieste::range_contains_error(__gnu_cxx::__normal_iterator<std::shared_ptr<trieste::NodeDef>*,std::vector<std::shared_ptr<trieste::NodeDef>,std::allocator<std::shared_ptr<trieste::NodeDef>>>>,__gnu_cxx::__normal_iterator<std::shared_ptr<trieste::NodeDef>*,std::vector<std::shared_ptr<trieste::NodeDef>,std::allocator<std::shared_ptr<trieste::NodeDef>>>>)::_lambda(auto:1&)_1_>
                                     (local_78._M_current,local_90.first), !bVar6)) &&
                 (pVar7 = replace(local_80,match,(Effect<Node> *)(puVar9 + 0x10),&local_78,
                                  (NodeIt *)&local_90,node), pVar7 != -1)) {
                local_70 = local_70 + pVar7;
                if ((local_80->direction_ & 4) == 0) {
                  local_90.first =
                       (((node->super___shared_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2>).
                        _M_ptr)->children).
                       super__Vector_base<std::shared_ptr<trieste::NodeDef>,_std::allocator<std::shared_ptr<trieste::NodeDef>_>_>
                       ._M_impl.super__Vector_impl_data._M_start;
                }
                else {
                  local_90.first =
                       (shared_ptr<trieste::NodeDef> *)((long)local_90.first + pVar7 * 0x10);
                }
                goto LAB_001625c0;
              }
            }
            local_90.first = local_78._M_current + 1;
            goto LAB_001625c0;
          }
        }
        else {
          lVar8 = 0;
        }
        sVar10 = sVar10 + lVar8;
        local_68._M_impl.super__Vector_impl_data._M_finish =
             local_68._M_impl.super__Vector_impl_data._M_finish + -1;
        this = local_80;
      }
      else {
        local_68._M_impl.super__Vector_impl_data._M_finish[-1].second._M_current =
             (shared_ptr<trieste::NodeDef> *)(p_Var1 + 0x10);
        if ((*(byte *)(*(long *)(*(long *)&p_Var1->field_0x0 + 0x10) + 8) & 0x40) == 0) {
          local_90.second._M_current =
               *(shared_ptr<trieste::NodeDef> **)(*(long *)&p_Var1->field_0x0 + 0x58);
          local_90.first = (shared_ptr<trieste::NodeDef> *)p_Var1;
          std::
          vector<std::pair<std::shared_ptr<trieste::NodeDef>&,__gnu_cxx::__normal_iterator<std::shared_ptr<trieste::NodeDef>*,std::vector<std::shared_ptr<trieste::NodeDef>,std::allocator<std::shared_ptr<trieste::NodeDef>>>>>,std::allocator<std::pair<std::shared_ptr<trieste::NodeDef>&,__gnu_cxx::__normal_iterator<std::shared_ptr<trieste::NodeDef>*,std::vector<std::shared_ptr<trieste::NodeDef>,std::allocator<std::shared_ptr<trieste::NodeDef>>>>>>>
          ::
          emplace_back<std::pair<std::shared_ptr<trieste::NodeDef>&,__gnu_cxx::__normal_iterator<std::shared_ptr<trieste::NodeDef>*,std::vector<std::shared_ptr<trieste::NodeDef>,std::allocator<std::shared_ptr<trieste::NodeDef>>>>>>
                    ((vector<std::pair<std::shared_ptr<trieste::NodeDef>&,__gnu_cxx::__normal_iterator<std::shared_ptr<trieste::NodeDef>*,std::vector<std::shared_ptr<trieste::NodeDef>,std::allocator<std::shared_ptr<trieste::NodeDef>>>>>,std::allocator<std::pair<std::shared_ptr<trieste::NodeDef>&,__gnu_cxx::__normal_iterator<std::shared_ptr<trieste::NodeDef>*,std::vector<std::shared_ptr<trieste::NodeDef>,std::allocator<std::shared_ptr<trieste::NodeDef>>>>>>>
                      *)&local_68,&local_90);
        }
      }
    }
    std::
    _Vector_base<std::pair<std::shared_ptr<trieste::NodeDef>_&,___gnu_cxx::__normal_iterator<std::shared_ptr<trieste::NodeDef>_*,_std::vector<std::shared_ptr<trieste::NodeDef>,_std::allocator<std::shared_ptr<trieste::NodeDef>_>_>_>_>,_std::allocator<std::pair<std::shared_ptr<trieste::NodeDef>_&,___gnu_cxx::__normal_iterator<std::shared_ptr<trieste::NodeDef>_*,_std::vector<std::shared_ptr<trieste::NodeDef>,_std::allocator<std::shared_ptr<trieste::NodeDef>_>_>_>_>_>_>
    ::~_Vector_base(&local_68);
  }
  else {
    sVar10 = 0;
  }
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_38);
  return sVar10;
}

Assistant:

size_t apply_special(Node root, Match& match)
    {
      size_t changes = 0;

      auto add = [&](Node& node) SNMALLOC_FAST_PATH_LAMBDA {
        // Don't examine Error or Lift nodes.
        if (node->type() & flag::internal)
          return false;

        if constexpr (Pre)
        {
          auto pre_f = pre_.find(node->type());
          if (pre_f != pre_.end())
            changes += pre_f->second(node);
        }
        if constexpr (Topdown)
          changes += match_children(node, match);

        return true;
      };

      auto remove = [&](Node& node) SNMALLOC_FAST_PATH_LAMBDA {
        if constexpr (!Topdown)
          changes += match_children(node, match);
        else
          snmalloc::UNUSED(node);
        if constexpr (Post)
        {
          auto post_f = post_.find(node->type());
          if (post_f != post_.end())
            changes += post_f->second(node);
        }
      };

      root->traverse(add, remove);

      return changes;
    }